

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFRestore<(moira::Instr)197,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  Ea<(moira::Mode)8,_2> result;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  cVar1 = 'f';
  lVar4 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar1;
    cVar1 = "frestore"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar2);
  }
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar2 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar3 & 0xffff | iVar2 << 0x10;
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmFRestore(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}